

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL FEqualDbl(double dbl1,double dbl2)

{
  uint32 uVar1;
  bool bVar2;
  uint32 *puVar3;
  double local_28;
  double dbl2_local;
  double dbl1_local;
  
  local_28 = dbl2;
  dbl2_local = dbl1;
  puVar3 = Js::NumberUtilities::LuLoDbl(&dbl2_local);
  uVar1 = *puVar3;
  puVar3 = Js::NumberUtilities::LuLoDbl(&local_28);
  if (uVar1 == *puVar3) {
    puVar3 = Js::NumberUtilities::LuHiDbl(&dbl2_local);
    uVar1 = *puVar3;
    puVar3 = Js::NumberUtilities::LuHiDbl(&local_28);
    if (uVar1 == *puVar3) {
      bVar2 = Js::NumberUtilities::IsNan(dbl2_local);
      bVar2 = !bVar2;
      goto LAB_00ab1721;
    }
    Js::NumberUtilities::LuHiDbl(&dbl2_local);
    Js::NumberUtilities::LuHiDbl(&local_28);
  }
  bVar2 = false;
LAB_00ab1721:
  return (BOOL)bVar2;
}

Assistant:

BOOL FEqualDbl(double dbl1, double dbl2)
    {
        // If the low ulongs don't match, they can't be equal.
        if (Js::NumberUtilities::LuLoDbl(dbl1) != Js::NumberUtilities::LuLoDbl(dbl2))
            return FALSE;

        // If the high ulongs don't match, they can be equal iff one is -0 and
        // the other is +0.
        if (Js::NumberUtilities::LuHiDbl(dbl1) != Js::NumberUtilities::LuHiDbl(dbl2))
        {
            return 0x80000000 == (Js::NumberUtilities::LuHiDbl(dbl1) | Js::NumberUtilities::LuHiDbl(dbl2)) &&
                0 == Js::NumberUtilities::LuLoDbl(dbl1);
        }

        // The bit patterns match. They are equal iff they are not Nan.
        return !Js::NumberUtilities::IsNan(dbl1);
    }